

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

size_t lua_rawlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  size_t sVar3;
  uint uVar4;
  
  pTVar2 = index2addr(L,idx);
  uVar4 = pTVar2->tt_ & 0x3f;
  sVar3 = 0;
  if (uVar4 < 7) {
    if (uVar4 == 4) {
      sVar3 = (size_t)(byte)(pTVar2->value_).f[0xb];
    }
    else if (uVar4 == 5) {
      iVar1 = luaH_getn((Table *)(pTVar2->value_).gc);
      sVar3 = (size_t)iVar1;
    }
  }
  else if (uVar4 == 7) {
    sVar3 = *(size_t *)((pTVar2->value_).f + 0x18);
  }
  else if (uVar4 == 0x14) {
    sVar3 = *(size_t *)((pTVar2->value_).f + 0x10);
  }
  return sVar3;
}

Assistant:

LUA_API size_t lua_rawlen (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttype(o)) {
    case LUA_TSHRSTR: return tsvalue(o)->shrlen;
    case LUA_TLNGSTR: return tsvalue(o)->u.lnglen;
    case LUA_TUSERDATA: return uvalue(o)->len;
    case LUA_TTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}